

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O2

int on_header(nghttp2_session *session,nghttp2_frame *frame,uint8_t *name,size_t namelen,
             uint8_t *value,size_t valuelen,uint8_t flags,void *userp)

{
  int32_t stream_id;
  HTTP *pHVar1;
  ulong uVar2;
  size_t sVar3;
  bool bVar4;
  int iVar5;
  CURLcode CVar6;
  Curl_easy *data;
  char **ppcVar7;
  char *pcVar8;
  long lVar9;
  int iVar10;
  dynbuf *s;
  size_t sStack_80;
  int local_64;
  char buffer [32];
  
  stream_id = (frame->hd).stream_id;
  data = (Curl_easy *)nghttp2_session_get_stream_user_data(session,stream_id);
  if (data == (Curl_easy *)0x0) {
    return -0x386;
  }
  pHVar1 = (data->req).p.http;
  if (pHVar1 == (HTTP *)0x0) {
    Curl_failf(data,"Internal NULL stream");
    return -0x386;
  }
  if ((frame->hd).type != '\x05') {
    if (pHVar1->bodystarted == true) {
      CVar6 = Curl_dyn_addf(&pHVar1->trailer_recvbuf,"%.*s: %.*s\r\n",namelen,name,valuelen,value);
      if (CVar6 != CURLE_OK) {
        return -0x386;
      }
      return 0;
    }
    if ((namelen == 7) && (iVar5 = bcmp(":status",name,7), iVar5 == 0)) {
      iVar5 = -1;
      if (valuelen == 3) {
        iVar10 = 0;
        for (lVar9 = 0;
            (iVar5 = iVar10, lVar9 != 3 && (iVar5 = -1, (byte)(value[lVar9] - 0x30) < 10));
            lVar9 = lVar9 + 1) {
          iVar10 = iVar10 * 10 + (uint)value[lVar9] + -0x30;
        }
      }
      pHVar1->status_code = iVar5;
      curl_msnprintf(buffer,0x20,":status:%u\r");
      CVar6 = Curl_headers_push(data,buffer,'\x10');
      if (CVar6 != CURLE_OK) {
        return -0x386;
      }
      CVar6 = Curl_dyn_addn(&pHVar1->header_recvbuf,"HTTP/2 ",7);
      if (CVar6 != CURLE_OK) {
        return -0x386;
      }
      CVar6 = Curl_dyn_addn(&pHVar1->header_recvbuf,value,valuelen);
      if (CVar6 != CURLE_OK) {
        return -0x386;
      }
      pcVar8 = " \r\n";
      sStack_80 = 3;
    }
    else {
      s = &pHVar1->header_recvbuf;
      CVar6 = Curl_dyn_addn(s,name,namelen);
      if (CVar6 != CURLE_OK) {
        return -0x386;
      }
      CVar6 = Curl_dyn_addn(s,": ",2);
      if (CVar6 != CURLE_OK) {
        return -0x386;
      }
      CVar6 = Curl_dyn_addn(s,value,valuelen);
      if (CVar6 != CURLE_OK) {
        return -0x386;
      }
      pcVar8 = "\r\n";
      sStack_80 = 2;
    }
    CVar6 = Curl_dyn_addn(&pHVar1->header_recvbuf,pcVar8,sStack_80);
    if (CVar6 != CURLE_OK) {
      return -0x386;
    }
    if (*(Curl_easy **)((long)userp + 0x4a0) != data) {
      Curl_expire(data,0,EXPIRE_RUN_NOW);
      return 0;
    }
    return 0;
  }
  iVar5 = strcmp(":authority",(char *)name);
  if (iVar5 == 0) {
    local_64 = 0;
    pcVar8 = curl_maprintf("%s:%d",*(undefined8 *)((long)userp + 0x98),
                           (ulong)*(uint *)((long)userp + 0x56c));
    if (pcVar8 == (char *)0x0) {
      return -0x386;
    }
    iVar5 = Curl_strcasecompare(pcVar8,(char *)value);
    bVar4 = true;
    if ((iVar5 == 0) &&
       ((*(int *)((long)userp + 0x56c) != *(int *)(*(long *)((long)userp + 0x3a0) + 0x80) ||
        (iVar5 = Curl_strcasecompare(*(char **)((long)userp + 0x98),(char *)value), iVar5 == 0)))) {
      bVar4 = false;
      nghttp2_submit_rst_stream(session,'\0',stream_id,1);
      local_64 = -0x386;
    }
    (*Curl_cfree)(pcVar8);
    if (!bVar4) {
      return local_64;
    }
  }
  if (pHVar1->push_headers == (char **)0x0) {
    pHVar1->push_headers_alloc = 10;
    ppcVar7 = (char **)(*Curl_cmalloc)(0x50);
    pHVar1->push_headers = ppcVar7;
    if (ppcVar7 != (char **)0x0) {
      pHVar1->push_headers_used = 0;
      goto LAB_004912aa;
    }
  }
  else {
    uVar2 = pHVar1->push_headers_used;
    if (uVar2 != pHVar1->push_headers_alloc) {
LAB_004912aa:
      pcVar8 = curl_maprintf("%s:%s",name,value);
      if (pcVar8 == (char *)0x0) {
        return 0;
      }
      sVar3 = pHVar1->push_headers_used;
      pHVar1->push_headers_used = sVar3 + 1;
      pHVar1->push_headers[sVar3] = pcVar8;
      return 0;
    }
    if (uVar2 < 0x3e9) {
      pHVar1->push_headers_alloc = uVar2 * 2;
      ppcVar7 = (char **)Curl_saferealloc(pHVar1->push_headers,uVar2 << 4);
      if (ppcVar7 != (char **)0x0) {
        pHVar1->push_headers = ppcVar7;
        goto LAB_004912aa;
      }
    }
    else {
      Curl_failf(data,"Too many PUSH_PROMISE headers");
      (*Curl_cfree)(pHVar1->push_headers);
    }
    pHVar1->push_headers = (char **)0x0;
  }
  return -0x209;
}

Assistant:

static int on_header(nghttp2_session *session, const nghttp2_frame *frame,
                     const uint8_t *name, size_t namelen,
                     const uint8_t *value, size_t valuelen,
                     uint8_t flags,
                     void *userp)
{
  struct HTTP *stream;
  struct Curl_easy *data_s;
  int32_t stream_id = frame->hd.stream_id;
  struct connectdata *conn = (struct connectdata *)userp;
  struct http_conn *httpc = &conn->proto.httpc;
  CURLcode result;
  (void)flags;

  DEBUGASSERT(stream_id); /* should never be a zero stream ID here */

  /* get the stream from the hash based on Stream ID */
  data_s = nghttp2_session_get_stream_user_data(session, stream_id);
  if(!data_s)
    /* Receiving a Stream ID not in the hash should not happen, this is an
       internal error more than anything else! */
    return NGHTTP2_ERR_CALLBACK_FAILURE;

  stream = data_s->req.p.http;
  if(!stream) {
    failf(data_s, "Internal NULL stream");
    return NGHTTP2_ERR_CALLBACK_FAILURE;
  }

  /* Store received PUSH_PROMISE headers to be used when the subsequent
     PUSH_PROMISE callback comes */
  if(frame->hd.type == NGHTTP2_PUSH_PROMISE) {
    char *h;

    if(!strcmp(H2H3_PSEUDO_AUTHORITY, (const char *)name)) {
      /* pseudo headers are lower case */
      int rc = 0;
      char *check = aprintf("%s:%d", conn->host.name, conn->remote_port);
      if(!check)
        /* no memory */
        return NGHTTP2_ERR_CALLBACK_FAILURE;
      if(!Curl_strcasecompare(check, (const char *)value) &&
         ((conn->remote_port != conn->given->defport) ||
          !Curl_strcasecompare(conn->host.name, (const char *)value))) {
        /* This is push is not for the same authority that was asked for in
         * the URL. RFC 7540 section 8.2 says: "A client MUST treat a
         * PUSH_PROMISE for which the server is not authoritative as a stream
         * error of type PROTOCOL_ERROR."
         */
        (void)nghttp2_submit_rst_stream(session, NGHTTP2_FLAG_NONE,
                                        stream_id, NGHTTP2_PROTOCOL_ERROR);
        rc = NGHTTP2_ERR_CALLBACK_FAILURE;
      }
      free(check);
      if(rc)
        return rc;
    }

    if(!stream->push_headers) {
      stream->push_headers_alloc = 10;
      stream->push_headers = malloc(stream->push_headers_alloc *
                                    sizeof(char *));
      if(!stream->push_headers)
        return NGHTTP2_ERR_TEMPORAL_CALLBACK_FAILURE;
      stream->push_headers_used = 0;
    }
    else if(stream->push_headers_used ==
            stream->push_headers_alloc) {
      char **headp;
      if(stream->push_headers_alloc > 1000) {
        /* this is beyond crazy many headers, bail out */
        failf(data_s, "Too many PUSH_PROMISE headers");
        Curl_safefree(stream->push_headers);
        return NGHTTP2_ERR_TEMPORAL_CALLBACK_FAILURE;
      }
      stream->push_headers_alloc *= 2;
      headp = Curl_saferealloc(stream->push_headers,
                               stream->push_headers_alloc * sizeof(char *));
      if(!headp) {
        stream->push_headers = NULL;
        return NGHTTP2_ERR_TEMPORAL_CALLBACK_FAILURE;
      }
      stream->push_headers = headp;
    }
    h = aprintf("%s:%s", name, value);
    if(h)
      stream->push_headers[stream->push_headers_used++] = h;
    return 0;
  }

  if(stream->bodystarted) {
    /* This is a trailer */
    H2BUGF(infof(data_s, "h2 trailer: %.*s: %.*s", namelen, name, valuelen,
                 value));
    result = Curl_dyn_addf(&stream->trailer_recvbuf,
                           "%.*s: %.*s\r\n", namelen, name,
                           valuelen, value);
    if(result)
      return NGHTTP2_ERR_CALLBACK_FAILURE;

    return 0;
  }

  if(namelen == sizeof(H2H3_PSEUDO_STATUS) - 1 &&
     memcmp(H2H3_PSEUDO_STATUS, name, namelen) == 0) {
    /* nghttp2 guarantees :status is received first and only once, and
       value is 3 digits status code, and decode_status_code always
       succeeds. */
    char buffer[32];
    stream->status_code = decode_status_code(value, valuelen);
    DEBUGASSERT(stream->status_code != -1);
    msnprintf(buffer, sizeof(buffer), H2H3_PSEUDO_STATUS ":%u\r",
              stream->status_code);
    result = Curl_headers_push(data_s, buffer, CURLH_PSEUDO);
    if(result)
      return NGHTTP2_ERR_CALLBACK_FAILURE;
    result = Curl_dyn_addn(&stream->header_recvbuf, STRCONST("HTTP/2 "));
    if(result)
      return NGHTTP2_ERR_CALLBACK_FAILURE;
    result = Curl_dyn_addn(&stream->header_recvbuf, value, valuelen);
    if(result)
      return NGHTTP2_ERR_CALLBACK_FAILURE;
    /* the space character after the status code is mandatory */
    result = Curl_dyn_addn(&stream->header_recvbuf, STRCONST(" \r\n"));
    if(result)
      return NGHTTP2_ERR_CALLBACK_FAILURE;
    /* if we receive data for another handle, wake that up */
    if(get_transfer(httpc) != data_s)
      Curl_expire(data_s, 0, EXPIRE_RUN_NOW);

    H2BUGF(infof(data_s, "h2 status: HTTP/2 %03d (easy %p)",
                 stream->status_code, data_s));
    return 0;
  }

  /* nghttp2 guarantees that namelen > 0, and :status was already
     received, and this is not pseudo-header field . */
  /* convert to a HTTP1-style header */
  result = Curl_dyn_addn(&stream->header_recvbuf, name, namelen);
  if(result)
    return NGHTTP2_ERR_CALLBACK_FAILURE;
  result = Curl_dyn_addn(&stream->header_recvbuf, STRCONST(": "));
  if(result)
    return NGHTTP2_ERR_CALLBACK_FAILURE;
  result = Curl_dyn_addn(&stream->header_recvbuf, value, valuelen);
  if(result)
    return NGHTTP2_ERR_CALLBACK_FAILURE;
  result = Curl_dyn_addn(&stream->header_recvbuf, STRCONST("\r\n"));
  if(result)
    return NGHTTP2_ERR_CALLBACK_FAILURE;
  /* if we receive data for another handle, wake that up */
  if(get_transfer(httpc) != data_s)
    Curl_expire(data_s, 0, EXPIRE_RUN_NOW);

  H2BUGF(infof(data_s, "h2 header: %.*s: %.*s", namelen, name, valuelen,
               value));

  return 0; /* 0 is successful */
}